

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall argo::lexer::append_to_number_buffer(lexer *this,char *s,size_t *index,int c)

{
  ulong uVar1;
  size_t st;
  json_parser_exception *this_00;
  size_t byte_index;
  
  uVar1 = *index;
  if (uVar1 < this->m_max_token_length) {
    *index = uVar1 + 1;
    s[uVar1] = (char)c;
    return;
  }
  this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
  st = this->m_max_token_length;
  byte_index = reader::get_byte_index(this->m_reader);
  json_parser_exception::json_parser_exception(this_00,number_too_long_e,st,byte_index);
  __cxa_throw(this_00,&json_parser_exception::typeinfo,std::exception::~exception);
}

Assistant:

void lexer::append_to_number_buffer(char *s, size_t &index, int c)
{
    if (index >= m_max_token_length)
    {
        throw json_parser_exception(
                json_parser_exception::number_too_long_e,
                m_max_token_length,
                m_reader.get_byte_index());
    }

    s[index++] = c;
}